

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O2

void output_example(vw *all,example *ec,bool *hit_loss,multi_ex *ec_seq)

{
  uint64_t *puVar1;
  wclass *pwVar2;
  int *piVar3;
  _func_void_int_string_v_array<char> *p_Var4;
  v_array<char> vVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  long lVar9;
  ostream *poVar10;
  uint32_t *puVar11;
  byte bVar12;
  int *piVar13;
  float *pfVar14;
  long lVar15;
  float fVar16;
  undefined1 in_stack_fffffffffffffdd8 [12];
  uint32_t prediction;
  wclass *pwVar17;
  vw *pvVar18;
  string local_1f8 [32];
  string outputString;
  stringstream outputStringStream;
  ostream local_1a8;
  
  pwVar2 = (ec->l).cs.costs._begin;
  pwVar17 = (ec->l).cs.costs._end;
  iVar8 = example_is_newline(ec);
  if (iVar8 == 0) {
    bVar6 = COST_SENSITIVE::ec_is_example_header(ec);
    if (!bVar6) {
      puVar1 = &all->sd->total_features;
      *puVar1 = *puVar1 + ec->num_features;
      prediction = (ec->pred).multiclass;
      cVar7 = (*(code *)PTR_test_label_002b1ae0)();
      if (cVar7 == '\0') {
        lVar9 = (long)pwVar17 - (long)pwVar2 >> 4;
        bVar12 = *hit_loss;
        puVar11 = &pwVar2->class_index;
        fVar16 = 0.0;
        while ((bVar6 = lVar9 != 0, lVar9 = lVar9 + -1, bVar6 && ((bVar12 & 1) == 0))) {
          if (prediction == *puVar11) {
            fVar16 = ((wclass *)(puVar11 + -1))->x;
            *hit_loss = true;
            bVar12 = 1;
          }
          puVar11 = puVar11 + 4;
        }
        all->sd->sum_loss = all->sd->sum_loss + (double)fVar16;
        all->sd->sum_loss_since_last_dump = (double)fVar16 + all->sd->sum_loss_since_last_dump;
      }
      piVar3 = (all->final_prediction_sink)._end;
      for (piVar13 = (all->final_prediction_sink)._begin; piVar13 != piVar3; piVar13 = piVar13 + 1)
      {
        (*all->print)(*piVar13,(float)(ec->pred).multiclass,0.0,ec->tag);
      }
      if (0 < all->raw_prediction) {
        outputString._M_dataplus._M_p = (pointer)&outputString.field_2;
        outputString._M_string_length = 0;
        outputString.field_2._M_local_buf[0] = '\0';
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&outputStringStream,(string *)&outputString,_S_out|_S_in);
        lVar15 = (long)pwVar17 - (long)pwVar2;
        pfVar14 = &pwVar2->partial_prediction;
        for (lVar9 = 0; lVar15 >> 4 != lVar9; lVar9 = lVar9 + 1) {
          if (lVar9 != 0) {
            std::operator<<(&local_1a8,' ');
          }
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          poVar10 = std::operator<<(poVar10,':');
          std::ostream::operator<<(poVar10,*pfVar14);
          pfVar14 = pfVar14 + 4;
        }
        p_Var4 = all->print_text;
        iVar8 = all->raw_prediction;
        pvVar18 = all;
        std::__cxx11::stringbuf::str();
        vVar5._end._4_4_ = prediction;
        vVar5._0_12_ = in_stack_fffffffffffffdd8;
        vVar5.end_array = (char *)pwVar17;
        vVar5.erase_count = (size_t)pvVar18;
        (*p_Var4)(iVar8,(string)ec->tag,vVar5);
        std::__cxx11::string::~string(local_1f8);
        std::__cxx11::stringstream::~stringstream((stringstream *)&outputStringStream);
        std::__cxx11::string::~string((string *)&outputString);
      }
      bVar6 = (bool)(*(code *)PTR_test_label_002b1ae0)(&ec->l);
      COST_SENSITIVE::print_update(all,bVar6,ec,ec_seq,false,prediction);
    }
  }
  return;
}

Assistant:

void output_example(vw& all, example& ec, bool& hit_loss, multi_ex* ec_seq)
{
  COST_SENSITIVE::label& ld = ec.l.cs;
  v_array<COST_SENSITIVE::wclass> costs = ld.costs;

  if (example_is_newline(ec)) return;
  if (COST_SENSITIVE::ec_is_example_header(ec)) return;

  all.sd->total_features += ec.num_features;

  float loss = 0.;

  uint32_t predicted_class = ec.pred.multiclass;

  if (!COST_SENSITIVE::cs_label.test_label(&ec.l))
  {
    for (size_t j=0; j<costs.size(); j++)
    {
      if (hit_loss) break;
      if (predicted_class == costs[j].class_index)
      {
        loss = costs[j].x;
        hit_loss = true;
      }
    }

    all.sd->sum_loss += loss;
    all.sd->sum_loss_since_last_dump += loss;
  }

  for (int sink : all.final_prediction_sink)
    all.print(sink, (float)ec.pred.multiclass, 0, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0) outputStringStream << ' ';
      outputStringStream << costs[i].class_index << ':' << costs[i].partial_prediction;
    }
    //outputStringStream << endl;
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  COST_SENSITIVE::print_update(all, COST_SENSITIVE::cs_label.test_label(&ec.l), ec, ec_seq, false, predicted_class);
}